

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmLocalUnixMakefileGenerator3::GetIndividualFileTargets
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *targets)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_node_base *__x;
  _Base_ptr p_Var2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
  localObjectFiles;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string base;
  
  p_Var1 = &localObjectFiles._M_t._M_impl.super__Rb_tree_header;
  localObjectFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  localObjectFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  localObjectFiles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  localObjectFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  localObjectFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  GetLocalObjectFiles(this,&localObjectFiles);
  for (p_Var2 = localObjectFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != p_Var1; p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    __x = p_Var2 + 1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(targets,(value_type *)__x);
    std::__cxx11::string::rfind((char *)__x,0x476b89);
    std::__cxx11::string::substr((ulong)&base,(ulong)__x);
    if (*(char *)((long)&p_Var2[2]._M_right + 1) == '\x01') {
      std::operator+(&local_70,&base,".i");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)targets,
                 &local_70);
      std::__cxx11::string::~string((string *)&local_70);
    }
    if (*(char *)((long)&p_Var2[2]._M_right + 2) == '\x01') {
      std::operator+(&local_70,&base,".s");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)targets,
                 &local_70);
      std::__cxx11::string::~string((string *)&local_70);
    }
    std::__cxx11::string::~string((string *)&base);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
  ::~_Rb_tree(&localObjectFiles._M_t);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::GetIndividualFileTargets(
  std::vector<std::string>& targets)
{
  std::map<std::string, LocalObjectInfo> localObjectFiles;
  this->GetLocalObjectFiles(localObjectFiles);
  for (auto const& localObjectFile : localObjectFiles) {
    targets.push_back(localObjectFile.first);

    std::string::size_type dot_pos = localObjectFile.first.rfind(".");
    std::string base = localObjectFile.first.substr(0, dot_pos);
    if (localObjectFile.second.HasPreprocessRule) {
      targets.push_back(base + ".i");
    }

    if (localObjectFile.second.HasAssembleRule) {
      targets.push_back(base + ".s");
    }
  }
}